

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

GPU_Image * GPU_CopyImageFromTarget(GPU_Target *target)

{
  GPU_Target *target_local;
  
  if (_gpu_current_renderer == (GPU_Renderer *)0x0) {
    target_local = (GPU_Target *)0x0;
  }
  else {
    if (((_gpu_current_renderer->current_context_target == (GPU_Target *)0x0) &&
        (target != (GPU_Target *)0x0)) && (target->context != (GPU_Context *)0x0)) {
      GPU_MakeCurrent(target,target->context->windowID);
    }
    if (_gpu_current_renderer->current_context_target == (GPU_Target *)0x0) {
      target_local = (GPU_Target *)0x0;
    }
    else {
      target_local = (GPU_Target *)
                     (*_gpu_current_renderer->impl->CopyImageFromTarget)
                               (_gpu_current_renderer,target);
    }
  }
  return (GPU_Image *)target_local;
}

Assistant:

GPU_Image* GPU_CopyImageFromTarget(GPU_Target* target)
{
    if(_gpu_current_renderer == NULL)
        return NULL;
    MAKE_CURRENT_IF_NONE(target);
    if(_gpu_current_renderer->current_context_target == NULL)
        return NULL;

    return _gpu_current_renderer->impl->CopyImageFromTarget(_gpu_current_renderer, target);
}